

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

Node * __thiscall rengine::TestBase::update(TestBase *this,Node *root)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  Node *root_local;
  TestBase *this_local;
  
  if (root != (Node *)0x0) {
    (*(root->super_SignalEmitter)._vptr_SignalEmitter[2])();
  }
  bVar1 = std::__cxx11::
          list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::empty
                    (&this->tests);
  if (bVar1) {
    this_local = (TestBase *)0x0;
  }
  else {
    ppSVar3 = std::__cxx11::
              list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::front
                        (&this->tests);
    this->m_currentTest = *ppSVar3;
    std::__cxx11::list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::
    pop_front(&this->tests);
    StaticRenderTest::setSurface(this->m_currentTest,(Surface *)this);
    iVar2 = (**this->m_currentTest->_vptr_StaticRenderTest)();
    this_local = (TestBase *)CONCAT44(extraout_var,iVar2);
  }
  return (Node *)this_local;
}

Assistant:

Node *update(Node *root) override {
        if (root)
            root->destroy();

        if (tests.empty())
            return 0;

        m_currentTest = tests.front();
        tests.pop_front();

        m_currentTest->setSurface(this);

        return m_currentTest->build();
    }